

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

bool __thiscall
QRhiGles2::compileShader
          (QRhiGles2 *this,GLuint program,QRhiShaderStage *shaderStage,QShaderVersion *shaderVersion
          )

{
  QHash<QRhiShaderStage,_unsigned_int> *this_00;
  Span *pSVar1;
  QOpenGLExtensions *pQVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  qsizetype qVar6;
  Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *pDVar7;
  char *pcVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  bool bVar10;
  ulong uVar11;
  char *pcVar12;
  Data *pDVar13;
  long in_FS_OFFSET;
  const_iterator cVar14;
  iterator iVar15;
  GLsizei length;
  GLint infoLogLength;
  GLint compiled;
  GLint srcLength;
  char *srcStr;
  GLuint shader;
  char local_b8 [24];
  char *local_a0;
  QByteArray local_98;
  uint local_74;
  int local_70;
  undefined4 local_6c;
  char *local_68;
  uint local_5c;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  shaderSource(&local_58,this,shaderStage,shaderVersion);
  qVar6 = local_58.d.size;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_0057b64e:
    bVar10 = false;
  }
  else {
    local_5c = 0xaaaaaaaa;
    this_00 = &this->m_shaderCache;
    cVar14 = QHash<QRhiShaderStage,_unsigned_int>::constFindImpl<QRhiShaderStage>
                       (this_00,shaderStage);
    if (cVar14.i.d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 &&
        cVar14.i.bucket == 0) {
      local_5c = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                   functions[0x40])((ulong)*(uint *)(&DAT_006c6ab4 +
                                                    (long)(int)shaderStage->m_type * 4));
      pcVar12 = local_58.d.ptr;
      if (local_58.d.ptr == (char *)0x0) {
        pcVar12 = (char *)&QByteArray::_empty;
      }
      local_6c = (undefined4)qVar6;
      local_68 = pcVar12;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x6c])((ulong)local_5c,1);
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x3c])((ulong)local_5c);
      local_70 = 0;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x58])((ulong)local_5c,0x8b81,&local_70);
      iVar4 = local_70;
      if (local_70 == 0) {
        local_74 = 0;
        (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
          [0x58])((ulong)local_5c,0x8b84,&local_74);
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char *)0x0;
        local_98.d.size = 0;
        if (1 < (int)local_74) {
          local_b8[0] = '\0';
          local_b8[1] = '\0';
          local_b8[2] = '\0';
          local_b8[3] = '\0';
          QByteArray::resize((longlong)&local_98);
          uVar5 = local_5c;
          uVar3 = local_74;
          pQVar2 = this->f;
          pcVar8 = QByteArray::data(&local_98);
          (*(((pQVar2->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x59])((ulong)uVar5,(ulong)uVar3,local_b8,pcVar8);
        }
        local_b8[0] = '\x02';
        local_b8[1] = '\0';
        local_b8[2] = '\0';
        local_b8[3] = '\0';
        local_b8[4] = '\0';
        local_b8[5] = '\0';
        local_b8[6] = '\0';
        local_b8[7] = '\0';
        local_b8[8] = '\0';
        local_b8[9] = '\0';
        local_b8[10] = '\0';
        local_b8[0xb] = '\0';
        local_b8[0xc] = '\0';
        local_b8[0xd] = '\0';
        local_b8[0xe] = '\0';
        local_b8[0xf] = '\0';
        local_b8[0x10] = '\0';
        local_b8[0x11] = '\0';
        local_b8[0x12] = '\0';
        local_b8[0x13] = '\0';
        local_b8[0x14] = '\0';
        local_b8[0x15] = '\0';
        local_b8[0x16] = '\0';
        local_b8[0x17] = '\0';
        local_a0 = "default";
        pcVar8 = local_98.d.ptr;
        if (local_98.d.ptr == (char *)0x0) {
          pcVar8 = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  (local_b8,"Failed to compile shader: %s\nSource was:\n%s",pcVar8,pcVar12);
        uVar11 = extraout_RDX;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            uVar11 = extraout_RDX_00;
          }
        }
      }
      else {
        pDVar7 = this_00->d;
        if ((pDVar7 != (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) &&
           (0x7f < (long)pDVar7->size)) {
          if (pDVar7 == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) {
            pDVar13 = (Data *)0x0;
LAB_0057b58d:
            uVar11 = 0;
          }
          else {
            if (1 < (uint)(pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i) {
              pDVar7 = QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::
                       detached(pDVar7);
              this_00->d = pDVar7;
            }
            pDVar13 = this_00->d;
            if (pDVar13->spans->offsets[0] != 0xff) goto LAB_0057b58d;
            uVar9 = 1;
            do {
              uVar11 = uVar9;
              if (pDVar13->numBuckets == uVar11) {
                pDVar13 = (Data *)0x0;
                uVar11 = 0;
                break;
              }
              uVar9 = uVar11 + 1;
            } while (pDVar13->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
          }
          if (pDVar13 != (Data *)0x0 || uVar11 != 0) {
            do {
              (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                functions[0x45])((ulong)*(uint *)(pDVar13->spans[uVar11 >> 7].entries
                                                  [pDVar13->spans[uVar11 >> 7].offsets
                                                   [(uint)uVar11 & 0x7f]].storage.data + 0x18));
              do {
                if (pDVar13->numBuckets - 1 == uVar11) {
                  pDVar13 = (Data *)0x0;
                  uVar11 = 0;
                  break;
                }
                uVar11 = uVar11 + 1;
              } while (pDVar13->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
            } while ((pDVar13 != (Data *)0x0) || (uVar11 != 0));
          }
          QHash<QRhiShaderStage,_unsigned_int>::clear(this_00);
        }
        iVar15 = QHash<QRhiShaderStage,unsigned_int>::emplace<unsigned_int_const&>
                           ((QHash<QRhiShaderStage,unsigned_int> *)this_00,shaderStage,&local_5c);
        uVar11 = iVar15.i.bucket;
      }
      if (iVar4 == 0) goto LAB_0057b64e;
    }
    else {
      pSVar1 = (cVar14.i.d)->spans;
      uVar9 = cVar14.i.bucket >> 7;
      uVar11 = (ulong)((uint)cVar14.i.bucket & 0x7f);
      local_5c = *(uint *)(pSVar1[uVar9].entries[pSVar1[uVar9].offsets[uVar11]].storage.data + 0x18)
      ;
    }
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x30])(program,(ulong)local_5c,uVar11);
    bVar10 = true;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool QRhiGles2::compileShader(GLuint program, const QRhiShaderStage &shaderStage, QShaderVersion *shaderVersion)
{
    const QByteArray source = shaderSource(shaderStage, shaderVersion);
    if (source.isEmpty())
        return false;

    GLuint shader;
    auto cacheIt = m_shaderCache.constFind(shaderStage);
    if (cacheIt != m_shaderCache.constEnd()) {
        shader = *cacheIt;
    } else {
        shader = f->glCreateShader(toGlShaderType(shaderStage.type()));
        const char *srcStr = source.constData();
        const GLint srcLength = source.size();
        f->glShaderSource(shader, 1, &srcStr, &srcLength);
        f->glCompileShader(shader);
        GLint compiled = 0;
        f->glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
        if (!compiled) {
            GLint infoLogLength = 0;
            f->glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);
            QByteArray log;
            if (infoLogLength > 1) {
                GLsizei length = 0;
                log.resize(infoLogLength);
                f->glGetShaderInfoLog(shader, infoLogLength, &length, log.data());
            }
            qWarning("Failed to compile shader: %s\nSource was:\n%s", log.constData(), source.constData());
            return false;
        }
        if (m_shaderCache.size() >= MAX_SHADER_CACHE_ENTRIES) {
            // Use the simplest strategy: too many cached shaders -> drop them all.
            for (uint shader : m_shaderCache)
                f->glDeleteShader(shader); // does not actually get released yet when attached to a not-yet-released program
            m_shaderCache.clear();
        }
        m_shaderCache.insert(shaderStage, shader);
    }

    f->glAttachShader(program, shader);

    return true;
}